

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void vecPrint(char *s,cupdlp_float *a,cupdlp_int n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  printf("%s: ",s);
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    printf("%.3f ",a[uVar2]);
  }
  putchar(10);
  return;
}

Assistant:

void vecPrint(const char *s, const cupdlp_float *a, cupdlp_int n) {
  cupdlp_printf("%s: ", s);
  for (cupdlp_int i = 0; i < n; ++i) {
    cupdlp_printf("%.3f ", a[i]);
  }
  cupdlp_printf("\n");
}